

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btrd.h
# Opt level: O2

IntType IsoSpec::invert(IntType t,RealType p,mt19937 *urng)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = p / (1.0 - p);
  dVar2 = pow(1.0 - p,(double)t);
  dVar3 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)stdunif,urng);
  lVar1 = 0;
  do {
    dVar5 = dVar2;
    if (dVar3 <= dVar5) {
      return lVar1;
    }
    dVar3 = dVar3 - dVar5;
    lVar1 = lVar1 + 1;
    dVar2 = (((double)(t + 1) * dVar4) / (double)lVar1 - dVar4) * dVar5;
  } while ((2.220446049250313e-16 <= dVar2) || (dVar5 <= dVar2));
  return lVar1;
}

Assistant:

IntType invert(IntType t, RealType p, std::mt19937& urng = random_gen)
{
    RealType q = 1 - p;
    RealType s = p / q;
    RealType a = (t + 1) * s;
    RealType r = pow((1 - p), static_cast<RealType>(t));
    RealType u = stdunif(urng);
    IntType x = 0;
    while(u > r) {
        u = u - r;
        ++x;
        RealType r1 = ((a/x) - s) * r;
        // If r gets too small then the round-off error
        // becomes a problem.  At this point, p(i) is
        // decreasing exponentially, so if we just call
        // it 0, it's close enough.  Note that the
        // minimum value of q_n is about 1e-7, so we
        // may need to be a little careful to make sure that
        // we don't terminate the first time through the loop
        // for float.  (Hence the test that r is decreasing)
        if(r1 < std::numeric_limits<RealType>::epsilon() && r1 < r) {
            break;
        }
        r = r1;
    }
    return x;
}